

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O0

void __thiscall
ExampleSOLHandler::OnDblSuffix<mp::SuffixReader<double>>
          (ExampleSOLHandler *this,SuffixReader<double> *sr)

{
  int iVar1;
  mapped_type *this_00;
  size_type sVar2;
  reference pvVar3;
  SuffixReader<double> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<int,_double> pVar4;
  pair<int,_double> val;
  mapped_type *suf_val;
  string *name;
  int kind;
  SuffixInfo *si;
  VecReader<std::pair<int,_double>_> *in_stack_ffffffffffffff60;
  undefined1 *__new_size;
  key_type *in_stack_ffffffffffffff98;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  undefined1 local_58 [40];
  mapped_type *local_30;
  string *local_28;
  int local_1c;
  SuffixInfo *local_18;
  SuffixReader<double> *local_10;
  
  local_10 = in_RSI;
  local_18 = mp::SuffixReader<double>::SufInfo(in_RSI);
  local_1c = mp::SuffixInfo::Kind(local_18);
  local_28 = mp::SuffixInfo::Name_abi_cxx11_(local_18);
  Model((ExampleSOLHandler *)in_RDI);
  __new_size = local_58;
  std::make_pair<std::__cxx11::string_const&,int&>(in_RDI,(int *)in_stack_ffffffffffffff60);
  this_00 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x11dcc6);
  local_30 = this_00;
  while( true ) {
    iVar1 = mp::VecReader<std::pair<int,_double>_>::Size(&local_10->super_SparseVecReader<double>);
    if (iVar1 == 0) break;
    pVar4 = mp::VecReader<std::pair<int,_double>_>::ReadNext(in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff60 = (VecReader<std::pair<int,_double>_> *)pVar4.second;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(local_30);
    if (sVar2 <= (ulong)(long)pVar4.first) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)__new_size);
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)pVar4.first);
    *pvVar3 = (value_type)in_stack_ffffffffffffff60;
  }
  return;
}

Assistant:

void OnDblSuffix(SuffixReader& sr) {
    const auto& si = sr.SufInfo();
    int kind = si.Kind();
    const std::string& name = si.Name();
    assert(0 != (kind & 4));
    auto& suf_val = Model().suf_out_[std::make_pair(name, kind)];
    while (sr.Size()) {
      std::pair<int, double> val = sr.ReadNext();
      if (suf_val.size() <= val.first)
        suf_val.resize(val.first+1);
      suf_val[val.first] = val.second;
    }
  }